

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Ptr_t * Llb_Nonlin4Multiply(DdManager *dd,DdNode *bCube,Vec_Ptr_t *vParts)

{
  long lVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  DdNode *n;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  uVar2 = vParts->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar6 = 8;
  if (6 < uVar2 - 1) {
    uVar6 = (ulong)uVar2;
  }
  pVVar3->nSize = 0;
  iVar5 = (int)uVar6;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < (int)uVar2) {
    lVar7 = 0;
    do {
      n = Cudd_bddAnd(dd,(DdNode *)vParts->pArray[lVar7],bCube);
      Cudd_Ref(n);
      iVar5 = (int)uVar6;
      if ((int)lVar7 == iVar5) {
        if (iVar5 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
          uVar6 = 0x10;
        }
        else {
          uVar6 = (ulong)(uint)(iVar5 * 2);
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar6 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,uVar6 * 8);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar5 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      lVar1 = lVar7 + 1;
      pVVar3->nSize = (int)lVar1;
      ppvVar4[lVar7] = n;
      lVar7 = lVar1;
    } while (lVar1 < vParts->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Multiply( DdManager * dd, DdNode * bCube, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vNew;
    DdNode * bTemp, * bFunc;
    int i;
    vNew = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
    {
        bTemp = Cudd_bddAnd( dd, bFunc, bCube );  Cudd_Ref( bTemp );
        Vec_PtrPush( vNew, bTemp );
    }
    return vNew;
}